

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# T.c
# Opt level: O2

void envy_bios_print_T_tmds_info(envy_bios *bios,FILE *out,uint mask)

{
  ushort uVar1;
  ulong uVar2;
  
  uVar1 = (bios->T).tmds_info.offset;
  if ((mask >> 0x17 & 1) == 0 || uVar1 == 0) {
    return;
  }
  if ((bios->T).tmds_info.valid != '\0') {
    fprintf((FILE *)out,"TMDS INFO table at 0x%x, version %x\n",(ulong)uVar1,
            (ulong)(bios->T).tmds_info.version);
    envy_bios_dump_hex(bios,out,(uint)(bios->T).tmds_info.offset,(uint)(bios->T).tmds_info.hlen,mask
                      );
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    for (uVar2 = 0; uVar2 < (bios->T).tmds_info.entriesnum; uVar2 = uVar2 + 1) {
      envy_bios_dump_hex(bios,out,(uint)(bios->T).tmds_info.entries[uVar2].offset,
                         (uint)(bios->T).tmds_info.rlen,mask);
      if ((int)mask < 0) {
        fputc(10,(FILE *)out);
      }
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf(_stderr,"Failed to parse TMDS INFO table at 0x%x, version %x\n\n",(ulong)uVar1,
          (ulong)(bios->T).tmds_info.version);
  return;
}

Assistant:

void
envy_bios_print_T_tmds_info(struct envy_bios *bios, FILE *out, unsigned mask)
{
	struct envy_bios_T_tmds_info *tmds = &bios->T.tmds_info;
	int i;

	if (!tmds->offset || !(mask & ENVY_BIOS_PRINT_T))
		return;
	if (!tmds->valid) {
		ENVY_BIOS_ERR("Failed to parse TMDS INFO table at 0x%x, version %x\n\n", tmds->offset, tmds->version);
		return;
	}

	fprintf(out, "TMDS INFO table at 0x%x, version %x\n", tmds->offset, tmds->version);
	envy_bios_dump_hex(bios, out, tmds->offset, tmds->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < tmds->entriesnum; ++i) {
		struct envy_bios_T_tmds_info_entry *e = &tmds->entries[i];
		envy_bios_dump_hex(bios, out, e->offset, tmds->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}